

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O2

void t4(void)

{
  uint uVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int iVar4;
  int got;
  uint got_00;
  gpioReport_t r;
  char p [32];
  
  puts("Pipe notification tests.");
  gpioSetPWMfrequency(0x19,0);
  gpioPWM(0x19,0);
  gpioSetPWMrange(0x19,100);
  uVar1 = gpioNotifyOpen();
  sprintf(p,"/dev/pigpio%d",(ulong)uVar1);
  __fd = open(p,0);
  iVar2 = gpioNotifyBegin(uVar1,0x2000000);
  got = 1;
  CHECK(4,1,iVar2,0,0,"notify open/begin");
  gpioPWM(0x19,0x32);
  time_sleep(0x4010000000000000);
  gpioPWM(0x19,0);
  iVar2 = gpioNotifyPause(uVar1);
  CHECK(4,2,iVar2,0,0,"notify pause");
  iVar2 = gpioNotifyClose(uVar1);
  CHECK(4,3,iVar2,0,0,"notify close");
  got_00 = 0;
  uVar1 = 0;
  iVar2 = 1;
  while( true ) {
    sVar3 = read(__fd,&r,0xc);
    if ((int)sVar3 != 0xc) break;
    if (got_00 != r.seqno) {
      got = 0;
    }
    iVar4 = 0;
    if (uVar1 == (r.level & 0x2000000)) {
      iVar4 = iVar2;
    }
    if (got_00 != 0) {
      iVar2 = iVar4;
    }
    uVar1 = r.level & 0x2000000 ^ 0x2000000;
    got_00 = got_00 + 1;
  }
  close(__fd);
  CHECK(4,4,got,1,0,"sequence numbers ok");
  CHECK(4,5,iVar2,1,0,"gpio toggled ok");
  CHECK(4,6,got_00,0x50,10,"number of notifications");
  return;
}

Assistant:

void t4()
{
   int h, e, f, n, s, b, l, seq_ok, toggle_ok;
   gpioReport_t r;
   char p[32];

   printf("Pipe notification tests.\n");

   gpioSetPWMfrequency(GPIO, 0);
   gpioPWM(GPIO, 0);
   gpioSetPWMrange(GPIO, 100);

   h = gpioNotifyOpen();

   sprintf(p, "/dev/pigpio%d", h);
   f = open(p, O_RDONLY);

   e = gpioNotifyBegin(h, (1<<GPIO));
   CHECK(4, 1, e, 0, 0, "notify open/begin");

   gpioPWM(GPIO, 50);
   time_sleep(4);
   gpioPWM(GPIO, 0);

   e = gpioNotifyPause(h);
   CHECK(4, 2, e, 0, 0, "notify pause");

   e = gpioNotifyClose(h);
   CHECK(4, 3, e, 0, 0, "notify close");

   n = 0;
   s = 0;
   l = 0;
   seq_ok = 1;
   toggle_ok = 1;

   while (1)
   {
      b = read(f, &r, 12);
      if (b == 12)
      {
         if (s != r.seqno) seq_ok = 0;

         if (n) if (l != (r.level&(1<<GPIO))) toggle_ok = 0;

         if (r.level&(1<<GPIO)) l = 0;
         else                   l = (1<<GPIO);
           
         s++;
         n++;

         // printf("%d %d %d %X\n", r.seqno, r.flags, r.tick, r.level);
      }
      else break;
   }

   close(f);

   CHECK(4, 4, seq_ok, 1, 0, "sequence numbers ok");

   CHECK(4, 5, toggle_ok, 1, 0, "gpio toggled ok");

   CHECK(4, 6, n, 80, 10, "number of notifications");
}